

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O0

void * address_space_map_sparc64
                 (AddressSpace *as,hwaddr addr,hwaddr *plen,_Bool is_write,MemTxAttrs attrs)

{
  uc_struct_conflict12 *uc_00;
  _Bool _Var1;
  FlatView *fv_00;
  MemoryRegion *mr_00;
  void *pvVar2;
  hwaddr hVar3;
  size_t local_80;
  uint local_74;
  uc_struct_conflict9 *uc;
  FlatView *fv;
  void *ptr;
  MemoryRegion *mr;
  hwaddr xlat;
  hwaddr l;
  hwaddr len;
  hwaddr *phStack_30;
  _Bool is_write_local;
  hwaddr *plen_local;
  hwaddr addr_local;
  AddressSpace *as_local;
  void *pvStack_10;
  MemTxAttrs attrs_local;
  
  xlat = *plen;
  uc_00 = as->uc;
  if (xlat == 0) {
    pvStack_10 = (void *)0x0;
  }
  else {
    l = xlat;
    len._7_1_ = is_write;
    phStack_30 = plen;
    plen_local = (hwaddr *)addr;
    addr_local = (hwaddr)as;
    as_local._4_4_ = attrs;
    fv_00 = address_space_to_flatview(as);
    mr_00 = flatview_translate_sparc64
                      ((uc_struct_conflict9 *)uc_00,fv_00,(hwaddr)plen_local,(hwaddr *)&mr,&xlat,
                       (_Bool)(len._7_1_ & 1),as_local._4_4_);
    _Var1 = memory_access_is_direct(mr_00,(_Bool)(len._7_1_ & 1));
    if (_Var1) {
      hVar3 = flatview_extend_translation
                        (*(uc_struct_conflict9 **)(addr_local + 0x30),fv_00,(hwaddr)plen_local,l,
                         mr_00,(hwaddr)mr,xlat,(_Bool)(len._7_1_ & 1),as_local._4_4_);
      *phStack_30 = hVar3;
      pvStack_10 = qemu_ram_ptr_length(*(uc_struct_conflict9 **)(addr_local + 0x30),mr_00->ram_block
                                       ,(ram_addr_t)mr,phStack_30,true);
    }
    else {
      if (xlat < 0x2000) {
        local_80 = xlat;
      }
      else {
        local_80 = 0x2000;
      }
      xlat = local_80;
      pvVar2 = qemu_memalign(0x2000,local_80);
      (mr_00->uc->bounce).buffer = pvVar2;
      (mr_00->uc->bounce).addr = (hwaddr)plen_local;
      (mr_00->uc->bounce).len = xlat;
      (mr_00->uc->bounce).mr = (MemoryRegion_conflict *)mr_00;
      if ((len._7_1_ & 1) == 0) {
        flatview_read(*(uc_struct_conflict9 **)(addr_local + 0x30),fv_00,(hwaddr)plen_local,
                      (MemTxAttrs)(local_74 & 0xff800000 | 1),(mr_00->uc->bounce).buffer,xlat);
      }
      *phStack_30 = xlat;
      pvStack_10 = (mr_00->uc->bounce).buffer;
    }
  }
  return pvStack_10;
}

Assistant:

void *address_space_map(AddressSpace *as,
                        hwaddr addr,
                        hwaddr *plen,
                        bool is_write,
                        MemTxAttrs attrs)
{
    hwaddr len = *plen;
    hwaddr l, xlat;
    MemoryRegion *mr;
    void *ptr;
    FlatView *fv;
    struct uc_struct *uc = as->uc;

    if (len == 0) {
        return NULL;
    }

    l = len;
    fv = address_space_to_flatview(as);
    mr = flatview_translate(uc, fv, addr, &xlat, &l, is_write, attrs);

    if (!memory_access_is_direct(mr, is_write)) {
        /* Avoid unbounded allocations */
        l = MIN(l, TARGET_PAGE_SIZE);
        mr->uc->bounce.buffer = qemu_memalign(TARGET_PAGE_SIZE, l);
        mr->uc->bounce.addr = addr;
        mr->uc->bounce.len = l;

        mr->uc->bounce.mr = mr;
        if (!is_write) {
            flatview_read(as->uc, fv, addr, MEMTXATTRS_UNSPECIFIED,
                               mr->uc->bounce.buffer, l);
        }

        *plen = l;
        return mr->uc->bounce.buffer;
    }


    *plen = flatview_extend_translation(as->uc, fv, addr, len, mr, xlat,
                                        l, is_write, attrs);
    ptr = qemu_ram_ptr_length(as->uc, mr->ram_block, xlat, plen, true);

    return ptr;
}